

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O1

NULLCArray NULLC::ShortToStr(short *r)

{
  char *pcVar1;
  short sVar2;
  char cVar3;
  int iVar4;
  short sVar5;
  char *pcVar6;
  char *pcVar7;
  int iVar8;
  char cVar9;
  NULLCArray NVar10;
  char buf [16];
  char local_28;
  char local_27 [15];
  
  if (r == (short *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    NVar10 = (NULLCArray)ZEXT812(0);
  }
  else {
    sVar2 = *r;
    iVar4 = (int)sVar2;
    iVar8 = iVar4 + ((int)sVar2 / 10) * -10;
    cVar3 = (char)iVar8;
    local_28 = -cVar3;
    if (0 < iVar8) {
      local_28 = cVar3;
    }
    local_28 = local_28 + '0';
    pcVar6 = local_27;
    pcVar7 = &local_28;
    for (sVar5 = sVar2; pcVar1 = pcVar6, 0x12 < (ushort)(sVar5 + 9U);
        sVar5 = (short)iVar8 - (sVar5 >> 0xf)) {
      sVar5 = (short)iVar4;
      iVar4 = (int)sVar5 >> 0x1f;
      iVar8 = (int)sVar5 / 10 + iVar4;
      iVar4 = iVar8 - iVar4;
      cVar3 = (char)(iVar4 % 10);
      cVar9 = -cVar3;
      if (0 < iVar4 % 10) {
        cVar9 = cVar3;
      }
      *pcVar1 = cVar9 + '0';
      pcVar6 = pcVar1 + 1;
      pcVar7 = pcVar1;
    }
    pcVar6 = pcVar1;
    if (sVar2 < 0) {
      pcVar6 = pcVar7 + 2;
      *pcVar1 = '-';
    }
    NVar10 = AllocArray(1,((int)pcVar6 - (int)&local_28) + 1,2);
    pcVar7 = NVar10.ptr;
    do {
      pcVar1 = pcVar6 + -1;
      pcVar6 = pcVar6 + -1;
      *pcVar7 = *pcVar1;
      pcVar7 = pcVar7 + 1;
    } while (pcVar6 != &local_28);
  }
  return NVar10;
}

Assistant:

NULLCArray NULLC::ShortToStr(short* r)
{
	NULLCArray arr = { 0, 0 };
	if(!r)
	{
		nullcThrowError("ERROR: null pointer access");
		return arr;
	}

	short number = *r;
	bool sign = 0;
	char buf[16];
	char *curr = buf;
	if(number < 0)
		sign = 1;

	*curr++ = (char)(abs(number % 10) + '0');
	while(number /= 10)
		*curr++ = (char)(abs(number % 10) + '0');
	if(sign)
		*curr++ = '-';
	arr = AllocArray(1, (int)(curr - buf) + 1, NULLC_TYPE_CHAR);
	char *str = arr.ptr;
	do 
	{
		--curr;
		*str++ = *curr;
	}while(curr != buf);
	return arr;
}